

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O2

value scope_export(scope sp)

{
  size_t size;
  value v;
  scope_export_cb_iterator_type export_iterator;
  undefined8 local_28;
  value *local_20;
  
  size = scope_size(sp);
  v = value_create_map((value *)0x0,size);
  if (v != (value)0x0) {
    local_28 = 0;
    local_20 = value_to_map(v);
    set_iterate(sp->objects,scope_export_cb_iterate,&local_28);
  }
  return v;
}

Assistant:

value scope_export(scope sp)
{
	struct scope_export_cb_iterator_type export_iterator;

	value export = value_create_map(NULL, scope_size(sp));

	if (export == NULL)
	{
		return NULL;
	}

	export_iterator.iterator = 0;
	export_iterator.values = value_to_map(export);

	set_iterate(sp->objects, &scope_export_cb_iterate, (set_cb_iterate_args)&export_iterator);

	return export;
}